

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

void __thiscall
slack::_detail::Slacking::Slacking(Slacking *this,string *token,bool throw_exception)

{
  allocator local_51;
  string local_50 [54];
  allocator local_1a;
  byte local_19;
  string *psStack_18;
  bool throw_exception_local;
  string *token_local;
  Slacking *this_local;
  
  local_19 = throw_exception;
  psStack_18 = token;
  token_local = &this->base_url;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"https://slack.com/api/",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  Session::Session(&this->session_,(bool)(local_19 & 1));
  std::__cxx11::string::string((string *)&this->token_,(string *)psStack_18);
  this->throw_exception_ = (bool)(local_19 & 1);
  CategoryApi::CategoryApi(&this->api,this);
  CategoryConversations::CategoryConversations(&this->conversations,this);
  CategoryChat::CategoryChat(&this->chat,this);
  CategoryUsers::CategoryUsers(&this->users,this);
  CategoryWebHook::CategoryWebHook(&this->hook,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"https://slack.com/api/",&local_51);
  Session::SetUrl(&this->session_,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  Session::SetToken(&this->session_,&this->token_);
  return;
}

Assistant:

Slacking(const std::string& token, bool throw_exception = true) 
    : session_{throw_exception}, token_{token}, throw_exception_{throw_exception}
    {
        session_.SetUrl("https://slack.com/api/");
        session_.SetToken(token_);
    }